

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

bool __thiscall google::protobuf::MapValueConstRef::GetBoolValue(MapValueConstRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage local_28;
  Voidify local_11;
  MapValueConstRef *local_10;
  MapValueConstRef *this_local;
  
  local_10 = this;
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_BOOL) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.h"
               ,0x293);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [34])"Protocol Buffer map usage error:\n");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [31])"MapValueConstRef::GetBoolValue");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [22])" type does not match\n");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [14])"  Expected : ");
    sVar3 = FieldDescriptor::CppTypeName(CPPTYPE_BOOL);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [2])0x1e65757);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [14])"  Actual   : ");
    CVar1 = type(this);
    sVar3 = FieldDescriptor::CppTypeName(CVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  return (bool)(*this->data_ & 1);
}

Assistant:

bool GetBoolValue() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_BOOL, "MapValueConstRef::GetBoolValue");
    return *reinterpret_cast<bool*>(data_);
  }